

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

void __thiscall
minja::SetTemplateToken::SetTemplateToken
          (SetTemplateToken *this,Location *loc,SpaceHandling pre,SpaceHandling post,string *ns,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vns,shared_ptr<minja::Expression> *v)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  element_type *peVar3;
  
  (this->super_TemplateToken)._vptr_TemplateToken = (_func_int **)&PTR__TemplateToken_001fe980;
  (this->super_TemplateToken).type = Set;
  (this->super_TemplateToken).location.source.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (loc->source).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var1 = (loc->source).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->super_TemplateToken).location.source.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->super_TemplateToken).location.pos = loc->pos;
  (this->super_TemplateToken).pre_space = pre;
  (this->super_TemplateToken).post_space = post;
  (this->super_TemplateToken)._vptr_TemplateToken = (_func_int **)&PTR__SetTemplateToken_001ff298;
  (this->ns)._M_dataplus._M_p = (pointer)&(this->ns).field_2;
  pcVar2 = (ns->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->ns,pcVar2,pcVar2 + ns->_M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->var_names,vns);
  (this->value).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar3 = (v->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (v->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (v->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->value).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  (this->value).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  (v->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  return;
}

Assistant:

SetTemplateToken(const Location & loc, SpaceHandling pre, SpaceHandling post, const std::string & ns, const std::vector<std::string> & vns, std::shared_ptr<Expression> && v)
      : TemplateToken(Type::Set, loc, pre, post), ns(ns), var_names(vns), value(std::move(v)) {}